

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof.c
# Opt level: O1

void __thiscall CProficiencies::SetProf(CProficiencies *this,int profindex,int proflevel)

{
  string_view fmt;
  int local_4;
  
  if ((uint)profindex < 0x19) {
    this->profs[(uint)profindex] = proflevel;
  }
  else {
    fmt._M_str = "CProficiencies::SetProf : profindex out of bounds [{}]";
    fmt._M_len = 0x36;
    CLogger::Warn<int&>((CLogger *)&RS.field_0x140,fmt,&local_4);
  }
  return;
}

Assistant:

void CProficiencies::SetProf(int profindex, int proflevel)
{
	auto profs_size = std::size(profs);
	if (profindex < 0 || profindex > profs_size - 1)
	{
		RS.Logger.Warn("CProficiencies::SetProf : profindex out of bounds [{}]", profindex);
		return;
	}

	profs[profindex] = proflevel;

	return;
}